

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

uint16 __thiscall
Network::Address::URL::stripPortFromAuthority
          (URL *this,uint16 defaultPortValue,bool saveNewAuthority)

{
  int iVar1;
  String local_68;
  undefined1 local_58 [8];
  String portValue;
  uint local_34;
  undefined1 local_30 [4];
  int portPos;
  String auth;
  int pos;
  bool saveNewAuthority_local;
  uint16 defaultPortValue_local;
  URL *this_local;
  
  auth.super_tagbstring.data._5_1_ = saveNewAuthority;
  auth.super_tagbstring.data._6_2_ = defaultPortValue;
  auth.super_tagbstring.data._0_4_ = Bstrlib::String::Find(&this->authority,']',0);
  if ((int)auth.super_tagbstring.data == -1) {
    Bstrlib::String::String((String *)local_30,&this->authority);
  }
  else {
    iVar1 = (int)auth.super_tagbstring.data + 1;
    Bstrlib::String::getLength(&this->authority);
    Bstrlib::String::midString((String *)local_30,(int)this + 0x18,iVar1);
  }
  iVar1 = Bstrlib::String::getLength((String *)local_30);
  local_34 = Bstrlib::String::reverseFind((String *)local_30,':',iVar1);
  if (local_34 == 0xffffffff) {
    this_local._6_2_ = auth.super_tagbstring.data._6_2_;
    local_34 = 0xffffffff;
  }
  else {
    iVar1 = local_34 + 1;
    Bstrlib::String::getLength((String *)local_30);
    Bstrlib::String::midString((String *)local_58,(int)local_30,iVar1);
    if ((auth.super_tagbstring.data._5_1_ & 1) != 0) {
      Bstrlib::operator+((Bstrlib *)&local_68,":",(String *)local_58);
      Bstrlib::String::findAndReplace(&this->authority,&local_68,"",0);
      Bstrlib::String::~String(&local_68);
    }
    local_34 = (uint)auth.super_tagbstring.data._6_2_;
    Bstrlib::String::Scan((String *)local_58,"%d",&local_34);
    if ((int)local_34 < 0) {
      local_34 = 0;
    }
    if (0xffff < (int)local_34) {
      local_34 = 0xffff;
    }
    this_local._6_2_ = (uint16)local_34;
    Bstrlib::String::~String((String *)local_58);
  }
  Bstrlib::String::~String((String *)local_30);
  return this_local._6_2_;
}

Assistant:

uint16 URL::stripPortFromAuthority(uint16 defaultPortValue, const bool saveNewAuthority)
        {
            int pos = authority.Find(']'); // Check IPV6
            String auth = pos == -1 ? authority : authority.midString(pos + 1, authority.getLength());
            int portPos = auth.reverseFind(':', auth.getLength());
            if (portPos != -1)
            {
                String portValue = auth.midString(portPos+1, auth.getLength());
                if (saveNewAuthority) authority.findAndReplace(":"+portValue, "");
                portPos = defaultPortValue;
                portValue.Scan("%d", &portPos);
                if (portPos < 0) portPos = 0;
                if (portPos > 65535) portPos = 65535;
                return (uint16)portPos;
            }
            return defaultPortValue;
        }